

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.h
# Opt level: O0

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::~InvocationInterlockPlacementPass
          (InvocationInterlockPlacementPass *this)

{
  InvocationInterlockPlacementPass *this_local;
  
  ~InvocationInterlockPlacementPass(this);
  operator_delete(this,0x1c0);
  return;
}

Assistant:

InvocationInterlockPlacementPass() {}